

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O0

void __thiscall CodeWriter::finish(CodeWriter *this)

{
  allocator local_31;
  string local_30;
  CodeWriter *local_10;
  CodeWriter *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"main_end",&local_31);
  tag(this,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->halt);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->newLine);
  return;
}

Assistant:

void CodeWriter::finish() {
    tag("main_end");
    moonOutput += halt;
    moonOutput += newLine;
}